

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_1::createChildren(TestCaseGroup *tessellationTests)

{
  TestContext *testCtx;
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_28;
  
  testCtx = (tessellationTests->super_TestNode).m_testCtx;
  pTVar2 = &createLimitsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createCoordinatesTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createWindingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createShaderInputOutputTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createMiscDrawTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createCommonEdgeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createFractionalSpacingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createPrimitiveDiscardTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createInvarianceTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = &createUserDefinedIOTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"geometry_interaction",
             "Tessellation and geometry shader interaction tests");
  local_28.m_data.ptr = (TestCaseGroup *)pTVar2;
  node = &createGeometryPassthroughTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,node);
  pTVar1 = local_28.m_data.ptr;
  pTVar2 = &createGeometryGridRenderLimitsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = local_28.m_data.ptr;
  pTVar2 = &createGeometryGridRenderScatterTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = local_28.m_data.ptr;
  pTVar2 = &createGeometryPointSizeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = local_28.m_data.ptr;
  local_28.m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&local_28);
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,&pTVar1->super_TestNode);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* tessellationTests)
{
	tcu::TestContext& testCtx = tessellationTests->getTestContext();

	tessellationTests->addChild(createLimitsTests				(testCtx));
	tessellationTests->addChild(createCoordinatesTests			(testCtx));
	tessellationTests->addChild(createWindingTests				(testCtx));
	tessellationTests->addChild(createShaderInputOutputTests	(testCtx));
	tessellationTests->addChild(createMiscDrawTests				(testCtx));
	tessellationTests->addChild(createCommonEdgeTests			(testCtx));
	tessellationTests->addChild(createFractionalSpacingTests	(testCtx));
	tessellationTests->addChild(createPrimitiveDiscardTests		(testCtx));
	tessellationTests->addChild(createInvarianceTests			(testCtx));
	tessellationTests->addChild(createUserDefinedIOTests		(testCtx));
	tessellationTests->addChild(createGeometryInteractionTests	(testCtx));
}